

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O2

void __thiscall
Diffusion::getTensorViscTerms
          (Diffusion *this,MultiFab *visc_terms,Real time,MultiFab **beta,MultiFab *betaCC,
          int betaComp)

{
  NavierStokesBase *pNVar1;
  int betaComp_00;
  MultiFab *pMVar2;
  EBFArrayBoxFactory *pEVar3;
  int i;
  long lVar4;
  MLEBTensorOp *this_00;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *this_01;
  _Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_> *this_02;
  initializer_list<amrex::Geometry> __l;
  initializer_list<amrex::BoxArray> __l_00;
  initializer_list<amrex::DistributionMapping> __l_01;
  initializer_list<const_amrex::EBFArrayBoxFactory_*> __l_02;
  initializer_list<std::array<amrex::LinOpBCType,_3UL>_> __l_03;
  initializer_list<std::array<amrex::LinOpBCType,_3UL>_> __l_04;
  initializer_list<amrex::MultiFab_*> __l_05;
  initializer_list<amrex::MultiFab_*> __l_06;
  allocator_type local_a34;
  allocator_type local_a33;
  allocator_type local_a32;
  allocator_type local_a31;
  Real local_a30;
  int local_a24;
  _Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  local_a20;
  EBFArrayBoxFactory *local_a08;
  __shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> local_a00;
  _Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  local_9f0;
  Array<LinOpBCType,_3> mlmg_hibc [3];
  Array<LinOpBCType,_3> mlmg_lobc [3];
  int allthere;
  LPInfo local_970;
  undefined1 local_950 [32];
  LinOpBCType LStack_930;
  undefined4 uStack_92c;
  MLMG mlmg;
  MultiFab s_tmp;
  MultiFab visc_tmp;
  MLEBTensorOp tensorop;
  
  local_a30 = time;
  checkBeta(this,beta,&allthere);
  if ((visc_terms->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < 3) {
    amrex::Abort_host(
                     "Diffusion::getTensorViscTerms(): visc_terms needs at least BL_SPACEDIM components"
                     );
  }
  pMVar2 = amrex::AmrLevel::get_data(&this->navier_stokes->super_AmrLevel,0,local_a30);
  if (*is_diffusive.super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start == 0)
  {
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&visc_terms->super_FabArray<amrex::FArrayBox>,0.0,0,3,
               (visc_terms->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]);
    return;
  }
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp =
       (_func_int **)0x1;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  do_agglomeration = false;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  do_consolidation = false;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  do_semicoarsening = false;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info._3_1_ = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.agg_grid_size
       = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.con_grid_size
       = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  has_metric_term = false;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info._13_3_ = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  max_coarsening_level = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  max_semicoarsening_level = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  semicoarsening_direction = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  hidden_direction = 0;
  local_a24 = betaComp;
  amrex::MultiFab::MultiFab
            (&visc_tmp,this->grids,this->dmap,3,2,(MFInfo *)&tensorop,
             (this->navier_stokes->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
                con_grid_size);
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp =
       (_func_int **)0x1;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  do_agglomeration = false;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  do_consolidation = false;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  do_semicoarsening = false;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info._3_1_ = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.agg_grid_size
       = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.con_grid_size
       = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  has_metric_term = false;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info._13_3_ = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  max_coarsening_level = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  max_semicoarsening_level = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  semicoarsening_direction = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  hidden_direction = 0;
  amrex::MultiFab::MultiFab
            (&s_tmp,this->grids,this->dmap,3,1,(MFInfo *)&tensorop,
             (this->navier_stokes->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
                con_grid_size);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&visc_tmp.super_FabArray<amrex::FArrayBox>,0.0);
  amrex::MultiFab::Copy(&s_tmp,pMVar2,0,0,3,0);
  local_970.do_semicoarsening = false;
  local_970.agg_grid_size = -1;
  local_970.con_grid_size = -1;
  local_970.do_agglomeration = (anonymous_namespace)::agglomeration != 0;
  local_970.has_metric_term = true;
  local_970.do_consolidation = (anonymous_namespace)::consolidation != 0;
  local_970.max_coarsening_level = 0;
  local_970.max_semicoarsening_level = 0;
  local_970.semicoarsening_direction = -1;
  local_970.hidden_direction = -1;
  pNVar1 = this->navier_stokes;
  pEVar3 = (EBFArrayBoxFactory *)
           __dynamic_cast((pNVar1->super_AmrLevel).m_factory._M_t.
                          super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                          _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                          &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (pEVar3 == (EBFArrayBoxFactory *)0x0) {
    __cxa_bad_cast();
  }
  memcpy(&mlmg,&(pNVar1->super_AmrLevel).geom,200);
  __l._M_len = 1;
  __l._M_array = (iterator)&mlmg;
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
            ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)mlmg_lobc,__l,&local_a34);
  amrex::BoxArray::BoxArray((BoxArray *)local_950,this->grids);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_950;
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
            ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)mlmg_hibc,__l_00,
             &local_a31);
  std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a00,
             (__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)this->dmap
            );
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_a00;
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
            ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             &local_a20,__l_01,&local_a32);
  __l_02._M_len = 1;
  __l_02._M_array = &local_a08;
  local_a08 = pEVar3;
  std::vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
  ::vector((vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
            *)&local_9f0,__l_02,&local_a33);
  amrex::MLEBTensorOp::MLEBTensorOp
            (&tensorop,(Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)mlmg_lobc,
             (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)mlmg_hibc,
             (Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             &local_a20,&local_970,
             (Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
              *)&local_9f0);
  std::
  _Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
  ::~_Vector_base((_Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                   *)&local_9f0);
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
            ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             &local_a20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a00._M_refcount);
  this_01 = (vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)mlmg_hibc;
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector(this_01);
  amrex::BoxArray::~BoxArray((BoxArray *)local_950);
  this_02 = (_Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)mlmg_lobc;
  std::_Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>::~_Vector_base(this_02);
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.maxorder =
       tensor_max_order;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    setDomainBC(this,(array<amrex::LinOpBCType,_3UL> *)this_02,
                (array<amrex::LinOpBCType,_3UL> *)this_01,(int)lVar4);
    this_01 = (vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
              ((long)&(this_01->
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>)._M_impl
                      .super__Vector_impl_data._M_finish + 4);
    this_02 = (_Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
              ((long)&(this_02->_M_impl).super__Vector_impl_data._M_finish + 4);
  }
  mlmg.do_fixed_number_of_iters = mlmg_lobc[0]._M_elems[2];
  mlmg.verbose = mlmg_lobc[0]._M_elems[0];
  mlmg.max_iters = mlmg_lobc[0]._M_elems[1];
  mlmg.nu1 = mlmg_lobc[1]._M_elems[0];
  mlmg.nu2 = mlmg_lobc[1]._M_elems[1];
  mlmg.nuf = mlmg_lobc[1]._M_elems[2];
  mlmg.nub = mlmg_lobc[2]._M_elems[0];
  mlmg.max_fmg_iters = mlmg_lobc[2]._M_elems[1];
  mlmg.bottom_solver = mlmg_lobc[2]._M_elems[2];
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)&mlmg;
  std::
  vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::vector((vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            *)&local_a20,__l_03,(allocator_type *)&local_a00);
  local_950._8_4_ = mlmg_hibc[0]._M_elems[2];
  local_950._0_4_ = mlmg_hibc[0]._M_elems[0];
  local_950._4_4_ = mlmg_hibc[0]._M_elems[1];
  local_950._12_4_ = (undefined4)mlmg_hibc[1]._M_elems._0_8_;
  local_950._16_4_ = SUB84(mlmg_hibc[1]._M_elems._0_8_,4);
  local_950._20_4_ = mlmg_hibc[1]._M_elems[2];
  local_950._24_4_ = mlmg_hibc[2]._M_elems[0];
  local_950._28_4_ = mlmg_hibc[2]._M_elems[1];
  LStack_930 = mlmg_hibc[2]._M_elems[2];
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)local_950;
  std::
  vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::vector((vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            *)&local_9f0,__l_04,(allocator_type *)&local_a08);
  amrex::MLLinOp::setDomainBC
            ((MLLinOp *)&tensorop,
             (Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              *)&local_a20,
             (Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              *)&local_9f0);
  std::
  _Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::~_Vector_base(&local_9f0);
  std::
  _Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::~_Vector_base(&local_a20);
  amrex::MultiFab::MultiFab((MultiFab *)&mlmg);
  betaComp_00 = local_a24;
  if (0 < this->level) {
    pNVar1 = this->coarser->navier_stokes;
    local_950._0_8_ = (pointer)0x1;
    local_950._8_4_ = 0;
    local_950._12_4_ = interior;
    local_950._16_4_ = interior;
    local_950._20_4_ = interior;
    local_950._24_4_ = interior;
    local_950._28_4_ = interior;
    _LStack_930 = 0;
    amrex::MultiFab::define
              ((MultiFab *)&mlmg,&(pNVar1->super_AmrLevel).grids,&(pNVar1->super_AmrLevel).dmap,3,1,
               (MFInfo *)local_950,
               (pNVar1->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_950 + 0x10));
    amrex::AmrLevel::FillPatch(&pNVar1->super_AmrLevel,(MultiFab *)&mlmg,1,local_a30,0,0,3,0);
    amrex::MLLinOp::setCoarseFineBC
              ((MLLinOp *)&tensorop,(MultiFab *)&mlmg,(this->crse_ratio).vect[0]);
  }
  amrex::AmrLevel::FillPatch(&this->navier_stokes->super_AmrLevel,&s_tmp,1,local_a30,0,0,3,0);
  amrex::MLCellLinOp::setLevelBC
            ((MLCellLinOp *)&tensorop,0,&s_tmp,(MultiFab *)0x0,(MultiFab *)0x0,(MultiFab *)0x0);
  amrex::MultiFab::~MultiFab((MultiFab *)&mlmg);
  this_00 = &tensorop;
  amrex::MLEBABecLap::setScalars(&this_00->super_MLEBABecLap,0.0,-1.0);
  setViscosity((Diffusion *)this_00,&tensorop,beta,betaComp_00,betaCC);
  amrex::MLMG::MLMG(&mlmg,(MLLinOp *)&tensorop);
  mlmg.max_fmg_iters = (anonymous_namespace)::max_fmg_iter;
  mlmg.bottom_verbose = 10;
  mlmg.verbose = 10;
  local_9f0._M_impl.super__Vector_impl_data._M_start = (pointer)&visc_tmp;
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)&local_9f0;
  std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_950,__l_05,
             (allocator_type *)&local_a08);
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)&local_a00;
  local_a00._M_ptr = (element_type *)&s_tmp;
  std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_a20,__l_06,
             (allocator_type *)&local_a34);
  amrex::MLMG::apply(&mlmg,(Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                           local_950,
                     (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_a20);
  std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
            ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_a20);
  std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
            ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_950);
  amrex::MLMG::~MLMG(&mlmg);
  amrex::MLEBTensorOp::~MLEBTensorOp(&tensorop);
  pEVar3 = (EBFArrayBoxFactory *)
           __dynamic_cast((this->navier_stokes->super_AmrLevel).m_factory._M_t.
                          super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                          _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                          &amrex::EBFArrayBoxFactory::typeinfo);
  if (pEVar3 != (EBFArrayBoxFactory *)0x0) {
    pMVar2 = amrex::EBFArrayBoxFactory::getVolFrac(pEVar3);
    amrex::single_level_weighted_redistribute
              (&visc_tmp,visc_terms,pMVar2,0,3,&(this->navier_stokes->super_AmrLevel).geom);
    amrex::MultiFab::~MultiFab(&s_tmp);
    amrex::MultiFab::~MultiFab(&visc_tmp);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void
Diffusion::getTensorViscTerms (MultiFab&              visc_terms,
                               Real                   time,
                               const MultiFab* const* beta,
                               const MultiFab* const  betaCC,
                               int                    betaComp)
{
    int allthere;
    checkBeta(beta, allthere);

    const int src_comp = Xvel;
    const int ncomp    = visc_terms.nComp();

    if (ncomp < AMREX_SPACEDIM)
        amrex::Abort("Diffusion::getTensorViscTerms(): visc_terms needs at least BL_SPACEDIM components");
    //
    // Before computing the godunov predicitors we may have to
    // precompute the viscous source terms.  To do this we must
    // construct a Laplacian operator, set the coeficients and apply
    // it to the time N data.  First, however, we must precompute the
    // fine N bndry values.  We will do this for each scalar that diffuses.
    //
    // Note: This routine DOES NOT fill grow cells
    //
    MultiFab&   S    = navier_stokes->get_data(State_Type,time);

    if (is_diffusive[src_comp])
    {
        int ng = 1;
        MultiFab visc_tmp(grids,dmap,AMREX_SPACEDIM,2,MFInfo(),navier_stokes->Factory()),
                 s_tmp(grids,dmap,AMREX_SPACEDIM,ng,MFInfo(),navier_stokes->Factory());
        visc_tmp.setVal(0.);
        MultiFab::Copy(s_tmp,S,Xvel,0,AMREX_SPACEDIM,0);

        //
        // Set up operator and apply to compute viscous terms.
        //
        const Real a = 0.0;
        const Real b = -1.0;

        // MLMG tensor solver
        {
           LPInfo info;
           info.setAgglomeration(agglomeration);
           info.setConsolidation(consolidation);
           info.setMaxCoarseningLevel(0);

#ifdef AMREX_USE_EB
           const auto& ebf = &dynamic_cast<EBFArrayBoxFactory const&>(navier_stokes->Factory());
           MLEBTensorOp tensorop({navier_stokes->Geom()}, {grids}, {dmap}, info, {ebf});
#else
           MLTensorOp tensorop({navier_stokes->Geom()}, {grids}, {dmap}, info);
#endif
           tensorop.setMaxOrder(tensor_max_order);

           // create right container
           Array<LinOpBCType,AMREX_SPACEDIM> mlmg_lobc[AMREX_SPACEDIM];
           Array<LinOpBCType,AMREX_SPACEDIM> mlmg_hibc[AMREX_SPACEDIM];
           // fill it
           for (int i=0; i<AMREX_SPACEDIM; i++)
             setDomainBC(mlmg_lobc[i], mlmg_hibc[i], Xvel+i);
           // pass to op
           tensorop.setDomainBC({AMREX_D_DECL(mlmg_lobc[0],mlmg_lobc[1],mlmg_lobc[2])},
                                {AMREX_D_DECL(mlmg_hibc[0],mlmg_hibc[1],mlmg_hibc[2])});

           // set coarse-fine BCs
           {
              MultiFab crsedata;

              if (level > 0) {
                auto& crse_ns = *(coarser->navier_stokes);
                crsedata.define(crse_ns.boxArray(), crse_ns.DistributionMap(),
                                AMREX_SPACEDIM, ng, MFInfo(),crse_ns.Factory());
                AmrLevel::FillPatch(crse_ns, crsedata, ng, time, State_Type, Xvel,
                                    AMREX_SPACEDIM);
                tensorop.setCoarseFineBC(&crsedata, crse_ratio[0]);
              }
              AmrLevel::FillPatch(*navier_stokes,s_tmp,ng,time,State_Type,Xvel,AMREX_SPACEDIM);
              tensorop.setLevelBC(0, &s_tmp);

              // FIXME: check divergence of vel
              // MLNodeLaplacian mllap({navier_stokes->Geom()}, {grids}, {dmap}, info);
              // mllap.setDomainBC(mlmg_lobc[0], mlmg_hibc[0]);
              // Rhs2.setVal(0.);
              // mllap.compDivergence({&Rhs2}, {&s_tmp});
              // amrex::WriteSingleLevelPlotfile("div_"+std::to_string(count), Rhs2, {AMREX_D_DECL("x","y","z")},navier_stokes->Geom(), 0.0, 0);
              //
           }

           tensorop.setScalars(a, b);

#ifdef AMREX_USE_EB
           setViscosity(tensorop, beta, betaComp, *betaCC);
#else
           amrex::ignore_unused(betaCC);
           setViscosity(tensorop, beta, betaComp);
#endif

           MLMG mlmg(tensorop);
           // FIXME -- consider making new parameters max_iter and bottom_verbose
           //mlmg.setMaxIter(max_iter);
           mlmg.setMaxFmgIter(max_fmg_iter);
           mlmg.setVerbose(10);
           mlmg.setBottomVerbose(10);
           //mlmg.setBottomVerbose(bottom_verbose);

           mlmg.apply({&visc_tmp}, {&s_tmp});
        }

#ifdef AMREX_USE_EB
        const amrex::MultiFab* weights;
        const auto& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(navier_stokes->Factory());
        weights = &(ebfactory.getVolFrac());
        amrex::single_level_weighted_redistribute(visc_tmp, visc_terms, *weights, 0, AMREX_SPACEDIM,
                                                  navier_stokes->Geom() );
#else
        MultiFab::Copy(visc_terms,visc_tmp,0,0,AMREX_SPACEDIM,0);
#endif
    }
    else
    {
        int ngrow = visc_terms.nGrow();
        visc_terms.setVal(0.0,src_comp,AMREX_SPACEDIM,ngrow);
    }
}